

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsv.c
# Opt level: O0

uint custom(svdir *s,char c)

{
  int iVar1;
  int *piVar2;
  char *local_d8;
  char *prog [2];
  undefined1 local_c0 [8];
  stat st;
  char a [10];
  int w;
  int pid;
  char c_local;
  svdir *s_local;
  
  if (s->islog == 0) {
    byte_copy((char *)((long)st.__glibc_reserved + 0x12),10,"control/?");
    a[0] = c;
    iVar1 = stat((char *)((long)st.__glibc_reserved + 0x12),(stat *)local_c0);
    if (iVar1 == 0) {
      if (((uint)st.st_nlink & 0x40) != 0) {
        a._6_4_ = fork();
        if (a._6_4_ == -1) {
          warn2("unable to fork for ",(char *)((long)st.__glibc_reserved + 0x12));
          return 0;
        }
        if (a._6_4_ == 0) {
          if ((haslog != 0) && (iVar1 = fd_copy(1,logpipe[1]), iVar1 == -1)) {
            warn2("unable to setup stdout for ",(char *)((long)st.__glibc_reserved + 0x12));
          }
          local_d8 = (char *)((long)st.__glibc_reserved + 0x12);
          prog[0] = (char *)0x0;
          execve((char *)((long)st.__glibc_reserved + 0x12),&local_d8,_environ);
          fatal("unable to run control/?");
        }
        do {
          iVar1 = wait_pid((int *)(a + 2),a._6_4_);
          if (iVar1 != -1) {
            return (uint)(((int)a._2_4_ >> 8 != 0 ^ 0xffU) & 1);
          }
          piVar2 = __errno_location();
        } while (*piVar2 == error_intr);
        warn2("unable to wait for child ",(char *)((long)st.__glibc_reserved + 0x12));
        return 0;
      }
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 == error_noent) {
        return 0;
      }
      warn2("unable to stat ",(char *)((long)st.__glibc_reserved + 0x12));
    }
  }
  return 0;
}

Assistant:

unsigned int custom(struct svdir *s, char c) {
  int pid;
  int w;
  char a[10];
  struct stat st;
  char *prog[2];

  if (s->islog) return(0);
  byte_copy(a, 10, "control/?");
  a[8] =c;
  if (stat(a, &st) == 0) {
    if (st.st_mode & S_IXUSR) {
      if ((pid =fork()) == -1) {
        warn2("unable to fork for ", a);
        return(0);
      }
      if (! pid) {
        if (haslog && fd_copy(1, logpipe[1]) == -1)
          warn2("unable to setup stdout for ", a);
        prog[0] =a;
        prog[1] =0;
        execve(a, prog, environ);
        fatal("unable to run control/?");
      }
      while (wait_pid(&w, pid) == -1) {
        if (errno == error_intr) continue;
        warn2("unable to wait for child ", a);
        return(0);
      }
      return(! wait_exitcode(w));
    }
  }
  else {
    if (errno == error_noent) return(0);
    warn2("unable to stat ", a);
  }
  return(0);
}